

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract.cpp
# Opt level: O0

void __thiscall
ContractFrame::CheckPrecondition(ContractFrame *this,bool expr,char *stringifed_expr)

{
  char *msg;
  string local_d0 [48];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string panic_msg;
  char *stringifed_expr_local;
  bool expr_local;
  ContractFrame *this_local;
  
  if (!expr) {
    s_abi_cxx11_(local_a0,"precondition failed in function \'",0x21);
    std::operator+(local_80,(char *)local_a0);
    s_abi_cxx11_(local_d0,"\': ",3);
    std::operator+(local_60,local_80);
    std::operator+(local_40,(char *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string(local_a0);
    msg = (char *)std::__cxx11::string::c_str();
    PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/contract.cpp"
              ,0x27,"CheckPrecondition",msg);
  }
  return;
}

Assistant:

void ContractFrame::CheckPrecondition(bool expr, const char *stringifed_expr) {
  if (!expr) {
    std::string panic_msg = "precondition failed in function '"s +
                            function_name + "': "s + stringifed_expr;
    PANIC(panic_msg.c_str());
  }
}